

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O3

void __thiscall
WavingSketch<8U,_1U,_4U>::Check
          (WavingSketch<8U,_1U,_4U> *this,HashMap<4U> *mp,count_type HIT,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  _Hash_node_base *p_Var11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined8 in_XMM2_Qb;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  
  p_Var11 = (mp->_M_h)._M_before_begin._M_nxt;
  if (p_Var11 == (_Hash_node_base *)0x0) {
    auVar12 = ZEXT816(0) << 0x40;
    dVar18 = 0.0;
    dVar16 = 0.0;
  }
  else {
    dVar16 = 0.0;
    iVar9 = 0;
    iVar10 = 0;
    iVar8 = 0;
    do {
      iVar4 = (*(this->super_Abstract<4U>)._vptr_Abstract[3])(this,p_Var11 + 1);
      iVar1 = *(int *)((long)&p_Var11[1]._M_nxt + 4);
      if (HIT < iVar1) {
        iVar9 = iVar9 + 1;
        iVar7 = -iVar4;
        if (0 < iVar4) {
          iVar7 = iVar4;
        }
        iVar4 = iVar7;
        if (HIT < iVar7) {
          iVar8 = iVar8 + 1;
          iVar7 = iVar1 - iVar7;
          iVar5 = -iVar7;
          if (0 < iVar7) {
            iVar5 = iVar7;
          }
          dVar16 = dVar16 + (double)iVar5 / (double)iVar1;
        }
      }
      iVar10 = iVar10 + (uint)(HIT < iVar4);
      p_Var11 = p_Var11->_M_nxt;
    } while (p_Var11 != (_Hash_node_base *)0x0);
    dVar18 = (double)iVar8;
    auVar12._0_8_ = (double)iVar9;
    auVar12._8_8_ = in_XMM2_Qb;
    auVar14._0_8_ = (double)iVar10;
    auVar14._8_8_ = in_XMM2_Qb;
    auVar12 = vunpcklpd_avx(auVar14,auVar12);
  }
  auVar15._8_8_ = dVar18;
  auVar15._0_8_ = dVar18;
  auVar12 = vdivpd_avx(auVar15,auVar12);
  dVar13 = auVar12._0_8_;
  auVar12 = vshufpd_avx(auVar12,auVar12,1);
  dVar17 = auVar12._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar13 + dVar17;
  uVar2 = vcmpsd_avx512f(auVar19,ZEXT816(0x3eb0c6f7a0b5ed8d),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  printf("%s:\tARE: %f\tCR: %f\tPR: %f\tF1: %f\n",dVar16 / dVar18,dVar17,
         (this->super_Abstract<4U>).name._M_dataplus._M_p);
  poVar6 = std::ostream::_M_insert<double>(dVar16 / dVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
  poVar6 = std::ostream::_M_insert<double>(dVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
  poVar6 = std::ostream::_M_insert<double>(dVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
  poVar6 = std::ostream::_M_insert<double>
                     (((dVar13 + dVar13) * dVar17) /
                      (double)((ulong)bVar3 * 0x3ff0000000000000 +
                              (ulong)!bVar3 * (long)(dVar13 + dVar17)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
  return;
}

Assistant:

void Check(const HashMap<DATA_LEN>& mp, count_type HIT, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::const_iterator it;
		count_type value = 0, all = 0, hit = 0, size = 0, flagtrue = 0;
		double aae = 0, are = 0, cr = 0, pr = 0, rt = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = QueryTopK(it->first);
			if (it->second > HIT) {
				all++;
				if (value < 0) {
					value = -value;
					flagtrue += 1;
				}
				if (value > HIT) {
					hit += 1;
					aae += abs(it->second - value);
					are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > HIT)
			{
				size += 1;
			}
		}

		aae /= hit;
		are /= hit;
		cr = hit / (double)all;
		pr = hit / (double)size;

		printf(
			"%s:\tARE: %f\tCR: %f\tPR: %f\tF1: %f\n",
			this->name.c_str(), are, cr, pr, 2 * pr * cr / ((cr + pr < 1e-6) ? 1 : cr + pr));
		*outs[0] << are << ",";
		*outs[1] << cr << ",";
		*outs[2] << pr << ",";
		*outs[3] << 2 * pr * cr / ((cr + pr < 1e-6) ? 1 : cr + pr) << ",";
	}